

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.cpp
# Opt level: O2

void __thiscall luna::Library::RegisterString(Library *this,Table *table,char *name,char *str)

{
  anon_union_8_9_8deb4486_for_Value_0 local_50;
  undefined4 local_48;
  anon_union_8_9_8deb4486_for_Value_0 local_40;
  undefined4 local_38;
  
  local_38 = 4;
  local_40.str_ = State::GetString(this->state_,name);
  local_48 = 4;
  local_50.str_ = State::GetString(this->state_,str);
  Table::SetValue(table,(Value *)&local_40,(Value *)&local_50);
  return;
}

Assistant:

void Library::RegisterString(Table *table, const char *name, const char *str)
    {
        Value k;
        k.type_ = ValueT_String;
        k.str_ = state_->GetString(name);

        Value v;
        v.type_ = ValueT_String;
        v.str_ = state_->GetString(str);
        table->SetValue(k, v);
    }